

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamStandardIndex::CheckMagicNumber(BamStandardIndex *this)

{
  IBamIODevice *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  BamException *pBVar3;
  allocator local_5e;
  allocator local_5d;
  char magic [4];
  string local_58;
  string local_38;
  
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[5])(pIVar1,magic,4);
  if (CONCAT44(extraout_var,iVar2) != 4) {
    pBVar3 = (BamException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_38,"BamStandardIndex::CheckMagicNumber",&local_5d)
    ;
    std::__cxx11::string::string((string *)&local_58,"could not read BAI magic number",&local_5e);
    BamException::BamException(pBVar3,&local_38,&local_58);
    __cxa_throw(pBVar3,&BamException::typeinfo,BamException::~BamException);
  }
  if (magic == (char  [4])0x1494142) {
    return;
  }
  pBVar3 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"BamStandardIndex::CheckMagicNumber",&local_5d);
  std::__cxx11::string::string((string *)&local_58,"invalid BAI magic number",&local_5e);
  BamException::BamException(pBVar3,&local_38,&local_58);
  __cxa_throw(pBVar3,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::CheckMagicNumber()
{

    // check 'magic number' to see if file is BAI index
    char magic[4];
    const int64_t numBytesRead = m_resources.Device->Read(magic, sizeof(magic));
    if (numBytesRead != 4)
        throw BamException("BamStandardIndex::CheckMagicNumber", "could not read BAI magic number");

    // compare to expected value
    if (strncmp(magic, BamStandardIndex::BAI_MAGIC, 4) != 0)
        throw BamException("BamStandardIndex::CheckMagicNumber", "invalid BAI magic number");
}